

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O1

void screen_byte_2(ubyte iobyte,uint address)

{
  ushort uVar1;
  ushort uVar2;
  ubyte uVar3;
  uint i;
  uint uVar4;
  uint uVar5;
  uint i1;
  uint uVar6;
  ushort i_00;
  undefined7 in_register_00000039;
  uint uVar7;
  uint i1_00;
  ushort local_54;
  ushort local_48;
  ushort local_40;
  
  uVar3 = crt_regs[1];
  uVar7 = (uint)CONCAT71(in_register_00000039,iobyte);
  uVar5 = (ushort)(address - ram_screen_start) ^ 0xffff8000;
  if (screen_start <= address) {
    uVar5 = (uint)address;
  }
  uVar5 = uVar5 - screen_start;
  uVar4 = (uVar5 & 7) + ((uVar5 & 0xffff) / ((uint)crt_regs[1] * 8) & 0x1fff) * 8;
  i1 = uVar7 & 0xffffff88;
  if ((int)i1 < 0x80) {
    if ((CONCAT71(in_register_00000039,iobyte) & 0xffffff88) != 0) {
      i1 = 2;
    }
  }
  else if (i1 == 0x80) {
    i1 = 8;
  }
  else {
    i1 = 10;
  }
  i1_00 = uVar7 & 0x44;
  if (i1_00 < 0x40) {
    if ((iobyte & 0x44) != 0) {
      i1_00 = 2;
    }
  }
  else if (i1_00 == 0x40) {
    i1_00 = 8;
  }
  else {
    i1_00 = 10;
  }
  uVar6 = (short)(uVar4 >> 2) + (short)uVar4;
  uVar4 = uVar7 & 0x22;
  if (0x1f < uVar4) {
    if (uVar4 == 0x22) {
      uVar4 = 10;
    }
    else {
      uVar4 = 8;
    }
  }
  uVar7 = uVar7 & 0x11;
  if (uVar7 < 0x10) {
    if ((iobyte & 0x11) != 0) {
      uVar7 = 2;
    }
  }
  else if (uVar7 == 0x10) {
    uVar7 = 8;
  }
  else {
    uVar7 = 10;
  }
  uVar2 = (ushort)((uVar5 & 0xffff) % ((uint)crt_regs[1] * 8));
  if (crt_regs[1] == 'P') {
    i_00 = uVar2 & 0x7f8;
    putpixel(i_00,uVar6,i1);
    uVar1 = uVar2 & 0x3f8;
    putpixel(uVar1 + 1,uVar6,i1);
    putpixel(uVar1 + 2,uVar6,i1_00);
    putpixel(uVar1 + 3,uVar6,i1_00);
    putpixel(uVar1 + 4,uVar6,uVar4);
    putpixel(uVar1 + 5,uVar6,uVar4);
    putpixel(uVar1 | 6,uVar6,uVar7);
    i = uVar2 | 7;
  }
  else {
    i_00 = uVar2 * 2 & 0xff0;
    putpixel(i_00,uVar6,i1);
    putpixel(i_00 + 1,uVar6,i1);
    putpixel(i_00 + 2,uVar6,i1);
    putpixel(i_00 + 3,uVar6,i1);
    putpixel(i_00 + 4,uVar6,i1_00);
    putpixel(i_00 + 5,uVar6,i1_00);
    putpixel(i_00 + 6,uVar6,i1_00);
    putpixel(i_00 + 7,uVar6,i1_00);
    putpixel(i_00 + 8,uVar6,uVar4);
    putpixel(i_00 + 9,uVar6,uVar4);
    putpixel(i_00 + 10,uVar6,uVar4);
    putpixel(i_00 + 0xb,uVar6,uVar4);
    putpixel(i_00 + 0xc,uVar6,uVar7);
    putpixel(i_00 + 0xd,uVar6,uVar7);
    putpixel(i_00 + 0xe,uVar6,uVar7);
    i = i_00 | 0xf;
  }
  putpixel(i,uVar6,uVar7);
  if ((uVar5 & 3) == 0) {
    uVar6 = uVar6 - 1;
    putpixel(i_00,uVar6,i1);
    putpixel(i_00 | 1,uVar6,i1);
    local_40 = i_00 | 5;
    local_54 = i_00 | 6;
    local_48 = i_00 | 7;
    if (uVar3 == 'P') {
      putpixel(i_00 | 2,uVar6,i1_00);
      putpixel(i_00 | 3,uVar6,i1_00);
      putpixel(i_00 | 4,uVar6,uVar4);
      putpixel(local_40,uVar6,uVar4);
      putpixel(local_54,uVar6,uVar7);
    }
    else {
      putpixel(i_00 | 2,uVar6,i1);
      putpixel(i_00 | 3,uVar6,i1);
      putpixel(i_00 | 4,uVar6,i1_00);
      putpixel(local_40,uVar6,i1_00);
      putpixel(local_54,uVar6,i1_00);
      putpixel(local_48,uVar6,i1_00);
      putpixel(i_00 + 8,uVar6,uVar4);
      putpixel(i_00 + 9,uVar6,uVar4);
      putpixel(i_00 + 10,uVar6,uVar4);
      putpixel(i_00 + 0xb,uVar6,uVar4);
      putpixel(i_00 + 0xc,uVar6,uVar7);
      putpixel(i_00 + 0xd,uVar6,uVar7);
      putpixel(i_00 + 0xe,uVar6,uVar7);
      local_48 = i_00 + 0xf;
    }
    putpixel(local_48,uVar6,uVar7);
    return;
  }
  return;
}

Assistant:

void screen_byte_2(ubyte iobyte, uint address) {
    uint x_cord = 0;         // general x coordinate variable
    uint y_cord = 0;         // general y coordinate variable
    uint virt_y_cord = 0;    // vertically scaled pc y coordinate
    uint bitsperline;      // bits per line variable
    ubyte colpix1;         // colour of pixel 1
    ubyte colpix2;         // colour of pixel 2
    ubyte colpix3;         // colour of pixel 3
    ubyte colpix4;         // colour of pixel 4

    // deal with hardware wraparound
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;

    bitsperline = 8 * crt_regs[1];  // calculate bits per scanline

    y_cord = address / bitsperline; // calculate character row
    y_cord *= 8;                  // convert to pixel row
    y_cord += (address % 8);        // add fraction of character offset

    virt_y_cord += y_cord + y_cord / 4; // scale output to fit pc screen

    x_cord = address % bitsperline;  // calculate x character column
    x_cord &= 0xFFF8;              // mask off lower 3 bits

    switch (iobyte & 0x88)                // calculate colour of pixel 1
    {
        case 0x00:
            colpix1 = 0x00;
            break;
        case 0x08:
            colpix1 = 0x02;
            break;
        case 0x80:
            colpix1 = 0x08;
            break;
        case 0x88:
            colpix1 = 0x0A;
            break;
    }

    switch (iobyte & 0x44)                // calculate colour of pixel 2
    {
        case 0x00:
            colpix2 = 0x00;
            break;
        case 0x04:
            colpix2 = 0x02;
            break;
        case 0x40:
            colpix2 = 0x08;
            break;
        case 0x44:
            colpix2 = 0x0A;
            break;
    }

    switch (iobyte & 0x22)                // calculate colour of pixel 3
    {
        case 0x00:
            colpix3 = 0x00;
            break;
        case 0x02:
            colpix3 = 0x02;
            break;
        case 0x20:
            colpix3 = 0x08;
            break;
        case 0x22:
            colpix3 = 0x0A;
            break;
    }

    switch (iobyte & 0x11)                // calcalate colour of pixel 4
    {
        case 0x00:
            colpix4 = 0x00;
            break;
        case 0x01:
            colpix4 = 0x02;
            break;
        case 0x10:
            colpix4 = 0x08;
            break;
        case 0x11:
            colpix4 = 0x0A;
            break;
    }


    if (bitsperline == 640)              // if this is a 40 character mode
    {
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix2);
        putpixel(x_cord + 3, virt_y_cord, colpix2);
        putpixel(x_cord + 4, virt_y_cord, colpix3);
        putpixel(x_cord + 5, virt_y_cord, colpix3);
        putpixel(x_cord + 6, virt_y_cord, colpix4);
        putpixel(x_cord + 7, virt_y_cord, colpix4);
    }
    else                               // if this is not a 40 character mode
    {
        x_cord <<= 1;                        // scale the x coorinate to fit the scren
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix1);
        putpixel(x_cord + 3, virt_y_cord, colpix1);
        putpixel(x_cord + 4, virt_y_cord, colpix2);
        putpixel(x_cord + 5, virt_y_cord, colpix2);
        putpixel(x_cord + 6, virt_y_cord, colpix2);
        putpixel(x_cord + 7, virt_y_cord, colpix2);
        putpixel(x_cord + 8, virt_y_cord, colpix3);
        putpixel(x_cord + 9, virt_y_cord, colpix3);
        putpixel(x_cord + 10, virt_y_cord, colpix3);
        putpixel(x_cord + 11, virt_y_cord, colpix3);
        putpixel(x_cord + 12, virt_y_cord, colpix4);
        putpixel(x_cord + 13, virt_y_cord, colpix4);
        putpixel(x_cord + 14, virt_y_cord, colpix4);
        putpixel(x_cord + 15, virt_y_cord, colpix4);
    }

    if (!(y_cord & 3))                      // if the y coordinate was scaled,
    {
        virt_y_cord--;                        // put the pixels on the original line

        if (bitsperline == 640)                 // if this is a 40 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, colpix1);
            putpixel(x_cord + 1, virt_y_cord, colpix1);
            putpixel(x_cord + 2, virt_y_cord, colpix2);
            putpixel(x_cord + 3, virt_y_cord, colpix2);
            putpixel(x_cord + 4, virt_y_cord, colpix3);
            putpixel(x_cord + 5, virt_y_cord, colpix3);
            putpixel(x_cord + 6, virt_y_cord, colpix4);
            putpixel(x_cord + 7, virt_y_cord, colpix4);
        }
        else                                  // if this is not a 40 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, colpix1);
            putpixel(x_cord + 1, virt_y_cord, colpix1);
            putpixel(x_cord + 2, virt_y_cord, colpix1);
            putpixel(x_cord + 3, virt_y_cord, colpix1);
            putpixel(x_cord + 4, virt_y_cord, colpix2);
            putpixel(x_cord + 5, virt_y_cord, colpix2);
            putpixel(x_cord + 6, virt_y_cord, colpix2);
            putpixel(x_cord + 7, virt_y_cord, colpix2);
            putpixel(x_cord + 8, virt_y_cord, colpix3);
            putpixel(x_cord + 9, virt_y_cord, colpix3);
            putpixel(x_cord + 10, virt_y_cord, colpix3);
            putpixel(x_cord + 11, virt_y_cord, colpix3);
            putpixel(x_cord + 12, virt_y_cord, colpix4);
            putpixel(x_cord + 13, virt_y_cord, colpix4);
            putpixel(x_cord + 14, virt_y_cord, colpix4);
            putpixel(x_cord + 15, virt_y_cord, colpix4);
        }

    }

}